

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Parenthesizer::Parenthesizer
          (Parenthesizer *this,ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *w,Expr e,
          int prec)

{
  Precedence PVar1;
  Buffer<char> *pBVar2;
  size_t sVar3;
  
  this->writer_ = w;
  this->write_paren_ = false;
  this->saved_precedence_ = w->precedence_;
  if (prec == -1) {
    prec = w->precedence_;
  }
  PVar1 = expr::PrecInfo::INFO[*(uint *)e.super_ExprBase.impl_];
  this->write_paren_ = (int)PVar1 < prec;
  if ((int)PVar1 < prec) {
    pBVar2 = w->writer_->buffer_;
    if (pBVar2->size_ == pBVar2->capacity_) {
      (**pBVar2->_vptr_Buffer)(pBVar2,pBVar2->size_ + 1);
    }
    sVar3 = pBVar2->size_;
    pBVar2->size_ = sVar3 + 1;
    pBVar2->ptr_[sVar3] = '(';
  }
  w->precedence_ = expr::PrecInfo::INFO[*(uint *)e.super_ExprBase.impl_];
  return;
}

Assistant:

ExprWriter<ExprTypes, VarNamer>::Parenthesizer::Parenthesizer(
    ExprWriter<ExprTypes, VarNamer> &w, Expr e, int prec)
: writer_(w), write_paren_(false) {
  saved_precedence_ = w.precedence_;
  if (prec == -1)
    prec = w.precedence_;
  write_paren_ = precedence(e) < prec;
  if (write_paren_)
    w.writer_ << '(';
  w.precedence_ = precedence(e);
}